

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quit.cpp
# Opt level: O0

int pstore::broker::shutdown(int __fd,int __how)

{
  bool bVar1;
  int extraout_EAX;
  undefined7 extraout_var;
  atomic<bool> *this;
  uint in_ECX;
  int in_EDX;
  int __how_00;
  int iVar2;
  undefined4 in_register_00000034;
  undefined4 in_register_0000003c;
  atomic<bool> *in_R8;
  double __x;
  double __x_00;
  not_null<const_char_*> local_c8;
  atomic<bool> *local_c0;
  allocator local_b1;
  string local_b0;
  not_null<pstore::broker::command_processor_*> local_90 [3];
  allocator local_71;
  string local_70;
  not_null<pstore::broker::command_processor_*> local_50;
  uint local_44;
  int iStack_40;
  uint ctr;
  bool local_31;
  uint local_30;
  int iStack_2c;
  bool expected;
  uint num_read_threads_local;
  int signum_local;
  scavenger *scav_local;
  command_processor *cp_local;
  not_null<std::atomic<bool>_*> uptime_done_local;
  not_null<maybe<pstore::http::server_status>_*> http_status_local;
  
  scav_local = (scavenger *)CONCAT44(in_register_0000003c,__fd);
  _num_read_threads_local = (scavenger *)CONCAT44(in_register_00000034,__how);
  local_31 = false;
  local_30 = in_ECX;
  iStack_2c = in_EDX;
  uptime_done_local.ptr_ = in_R8;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    ((atomic<bool> *)&done,&local_31,true,memory_order_seq_cst);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"pstore broker is exiting.\n");
    pstore::gsl::not_null<const_char_*>::not_null
              ((not_null<const_char_*> *)&stack0xffffffffffffffc0,"performing shutdown");
    iVar2 = iStack_40;
    log((pstore *)0x6,__x);
    gc_sigint(iStack_2c);
    if (_num_read_threads_local != (scavenger *)0x0) {
      scavenger::shutdown(_num_read_threads_local,iVar2,__how_00);
    }
    if (scav_local != (scavenger *)0x0) {
      for (local_44 = 0; local_44 < local_30; local_44 = local_44 + 1) {
        pstore::gsl::not_null<pstore::broker::command_processor_*>::not_null
                  (&local_50,(command_processor *)scav_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_70,"_QUIT",&local_71);
        anon_unknown.dwarf_adcb1::push(local_50,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
      }
      pstore::gsl::not_null<pstore::broker::command_processor_*>::not_null
                (local_90,(command_processor *)scav_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b0,"_CQUIT",&local_b1);
      anon_unknown.dwarf_adcb1::push(local_90[0],&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    }
    local_c0 = uptime_done_local.ptr_;
    http::quit((not_null<pstore::maybe<pstore::http::server_status,_void>_*>)uptime_done_local.ptr_)
    ;
    this = pstore::gsl::not_null::operator_cast_to_atomic_((not_null *)&cp_local);
    std::atomic<bool>::operator=(this,true);
    pstore::gsl::not_null<const_char_*>::not_null(&local_c8,"shutdown requests complete");
    log((pstore *)0x6,__x_00);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void shutdown (command_processor * const cp, scavenger * const scav, int const signum,
                       unsigned const num_read_threads,
                       not_null<maybe<pstore::http::server_status> *> const http_status,
                       not_null<std::atomic<bool> *> const uptime_done) {

            // Set the global "done" flag unless we're already shutting down. The latter condition
            // happens if a "SUICIDE" command is received and the quit thread is woken in response.
            bool expected = false;
            if (done.compare_exchange_strong (expected, true)) {
                std::cerr << "pstore broker is exiting.\n";
                log (priority::info, "performing shutdown");

                // Tell the gcwatcher thread to exit.
                broker::gc_sigint (signum);

                if (scav != nullptr) {
                    scav->shutdown ();
                }

                if (cp != nullptr) {
                    // Ask the read-loop threads to quit
                    for (auto ctr = 0U; ctr < num_read_threads; ++ctr) {
                        push (cp, read_loop_quit_command);
                    }
                    // Finally ask the command loop thread to exit.
                    push (cp, command_loop_quit_command);
                }

                pstore::http::quit (http_status);
                *uptime_done = true;

                log (priority::info, "shutdown requests complete");
            }
        }